

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr1502.cpp
# Opt level: O2

void IKSolver::polyroots3(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  int i;
  long lVar8;
  uint uVar9;
  double *pdVar10;
  complex<double> *__x;
  long lVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  IkReal err [3];
  bool visited [3];
  undefined1 auStack_105 [45];
  double local_d8 [4];
  complex<double> coeffs [3];
  complex<double> local_78;
  complex<double> roots [3];
  
  dVar13 = *rawcoeffs;
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    polyroots2(rawcoeffs + 1,rawroots,numroots);
    return;
  }
  dVar12 = 0.0;
  coeffs[2]._M_value._0_8_ = 0;
  coeffs[2]._M_value._8_8_ = 0;
  coeffs[1]._M_value._0_8_ = 0;
  coeffs[1]._M_value._8_8_ = 0;
  coeffs[0]._M_value._0_8_ = 0;
  coeffs[0]._M_value._8_8_ = 0;
  for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
    dVar12 = *(double *)((long)rawcoeffs + lVar6 + 8) / dVar13;
    *(double *)(coeffs[0]._M_value + lVar6 * 2) = dVar12;
    *(undefined8 *)(coeffs[0]._M_value + lVar6 * 2 + 8) = 0;
  }
  roots[2]._M_value._0_8_ = 0;
  roots[2]._M_value._8_8_ = 0;
  roots[0]._M_value._0_8_ = 0x3ff0000000000000;
  roots[0]._M_value._8_8_ = 0;
  roots[1]._M_value._0_8_ = 0x3fd999999999999a;
  roots[1]._M_value._8_8_ = 0x3feccccccccccccd;
  local_d8[0] = 1.0;
  local_d8[1] = 1.0;
  std::operator*(roots + 1,roots + 1);
  uVar5 = coeffs[0]._M_value._8_8_;
  uVar4 = coeffs[0]._M_value._0_8_;
  roots[2]._M_value._8_8_ = dVar12;
  local_d8[2] = 1.0;
  iVar7 = 0;
  do {
    if (iVar7 == 0x6e) break;
    lVar11 = 0;
    bVar2 = false;
    for (lVar6 = 0; dVar13 = 2.842170943040401e-14, lVar6 != 3; lVar6 = lVar6 + 1) {
      if (2.842170943040401e-14 <= local_d8[lVar6]) {
        __x = roots + lVar6;
        dVar12 = *(double *)(roots[lVar6]._M_value + 8) + (double)uVar5;
        unique0x10000199 = SUB84(dVar12,0);
        _visited = *(double *)__x->_M_value + (double)uVar4;
        unique0x1000019d = (int)((ulong)dVar12 >> 0x20);
        for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 0x10) {
          std::operator*(__x,(complex<double> *)visited);
          dVar12 = dVar13 + *(double *)(coeffs[1]._M_value + lVar8 + 8);
          unique0x100001bd = SUB84(dVar12,0);
          _visited = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) +
                     *(double *)(coeffs[1]._M_value + lVar8);
          unique0x100001c1 = (int)((ulong)dVar12 >> 0x20);
        }
        for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
          if (lVar11 != lVar8) {
            dVar13 = *(double *)__x->_M_value;
            dVar12 = *(double *)(roots[0]._M_value + lVar8);
            if (((dVar13 != dVar12) || (NAN(dVar13) || NAN(dVar12))) ||
               (*(double *)(roots[lVar6]._M_value + 8) != *(double *)(roots[0]._M_value + lVar8 + 8)
               )) {
              dVar14 = *(double *)(roots[lVar6]._M_value + 8) -
                       *(double *)(roots[0]._M_value + lVar8 + 8);
              local_78._M_value._8_4_ = SUB84(dVar14,0);
              local_78._M_value._0_8_ = dVar13 - dVar12;
              local_78._M_value._12_4_ = (int)((ulong)dVar14 >> 0x20);
              std::complex<double>::operator/=((complex<double> *)visited,&local_78);
            }
          }
        }
        dVar13 = *(double *)(roots[lVar6]._M_value + 8) - (double)auStack_105._5_8_;
        auVar1._8_4_ = SUB84(dVar13,0);
        auVar1._0_8_ = *(double *)__x->_M_value - _visited;
        auVar1._12_4_ = (int)((ulong)dVar13 >> 0x20);
        *(undefined1 (*) [16])__x->_M_value = auVar1;
        dVar13 = std::abs<double>((complex<double> *)visited);
        local_d8[lVar6] = dVar13;
        bVar2 = true;
      }
      lVar11 = lVar11 + 0x10;
    }
    iVar7 = iVar7 + 1;
  } while (bVar2);
  *numroots = 0;
  auVar3._13_3_ = 0;
  auVar3._0_13_ = auStack_105._0_13_;
  _visited = (_ComplexT)(auVar3 << 0x18);
  lVar6 = 0;
  iVar7 = 0;
  while( true ) {
    if (lVar6 == 3) {
      return;
    }
    if (visited[lVar6] == false) break;
LAB_00130c86:
    lVar6 = lVar6 + 1;
  }
  dVar13 = *(double *)roots[lVar6]._M_value;
  dVar12 = *(double *)(roots[lVar6]._M_value + 8);
  uVar9 = 1;
  lVar11 = lVar6;
  dVar14 = dVar13;
  dVar15 = dVar12;
  do {
    pdVar10 = (double *)(roots[lVar11 + 1]._M_value + 8);
    lVar8 = lVar11;
    while( true ) {
      lVar11 = lVar8 + 1;
      if (lVar11 == 3) {
        if (1 < uVar9) {
          dVar15 = dVar15 / (double)(int)uVar9;
        }
        if (ABS(dVar15) < 1.4901161193847656e-08) {
          if (1 < uVar9) {
            dVar14 = dVar14 / (double)(int)uVar9;
          }
          lVar11 = (long)iVar7;
          iVar7 = iVar7 + 1;
          *numroots = iVar7;
          rawroots[lVar11] = dVar14;
        }
        goto LAB_00130c86;
      }
      if ((ABS(dVar13 - pdVar10[-1]) < 1.4901161193847656e-08) && (ABS(dVar12 - *pdVar10) < 0.002))
      break;
      pdVar10 = pdVar10 + 2;
      lVar8 = lVar11;
    }
    dVar14 = dVar14 + pdVar10[-1];
    dVar15 = dVar15 + *pdVar10;
    uVar9 = uVar9 + 1;
    visited[lVar8 + 1] = true;
  } while( true );
}

Assistant:

static inline void polyroots3(IkReal rawcoeffs[3+1], IkReal rawroots[3], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots2(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[3];
    const int maxsteps = 110;
    for(int i = 0; i < 3; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[3];
    IkReal err[3];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 3; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 3; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 3; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 3; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[3] = {false};
    for(int i = 0; i < 3; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 3; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}